

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::append<char[1]>(path *this,char (*source) [1])

{
  format fmt;
  ulong uVar2;
  allocator<char> local_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  impl_string_type local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  long *plVar1;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,*source,&local_81);
  plVar1 = local_40;
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_80,local_40,local_38 + (long)local_40);
  fmt = (format)plVar1;
  if (local_40 != local_30) {
    uVar2 = local_30[0] + 1;
    operator_delete(local_40,uVar2);
    fmt = (format)uVar2;
  }
  if (local_80 == &local_70) {
    local_60.field_2._8_8_ = local_70._8_8_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_60.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  postprocess_path_with_format(&local_60,fmt);
  operator/=(this,(path *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0])
                             + 1);
  }
  return this;
}

Assistant:

inline path& path::append(const Source& source)
{
    return this->operator/=(path(detail::toUtf8(source)));
}